

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O3

bool __thiscall
gmlc::containers::
DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>::
addSearchTerm(DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>
              *this,string_view searchValue,InterfaceHandle *existingValue)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar3;
  byte bVar4;
  _Base_ptr p_Var5;
  long lVar6;
  _Base_ptr p_Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar9;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_str = searchValue._M_str;
  local_28._M_len = searchValue._M_len;
  p_Var5 = (this->lookup2)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var1 = &(this->lookup2)._M_t._M_impl.super__Rb_tree_header;
    iVar2 = existingValue->hid;
    p_Var7 = &p_Var1->_M_header;
    do {
      if (iVar2 <= (int)p_Var5[1]._M_color) {
        p_Var7 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < iVar2];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var7 != p_Var1) && ((int)p_Var7[1]._M_color <= iVar2)) {
      StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                ((StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>> *)
                 &this->names,&local_28);
      lVar6 = (long)(this->names).bsize;
      ppbVar3 = (this->names).dataptr;
      if (lVar6 == 0) {
        pbVar8 = ppbVar3[((this->names).csize >> 5) - 1] + 0x1f;
      }
      else {
        pbVar8 = ppbVar3[(this->names).dataSlotIndex] + lVar6 + -1;
      }
      pVar9 = std::
              _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::_M_emplace<std::__cxx11::string&,unsigned_long&>
                        ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)&this->lookup1,pbVar8,&p_Var7[1]._M_parent);
      bVar4 = pVar9.second;
      goto LAB_001f4196;
    }
  }
  bVar4 = 0;
LAB_001f4196:
  return (bool)(bVar4 & 1);
}

Assistant:

auto addSearchTerm(
            std::string_view searchValue,
            const searchType2& existingValue)
        {
            auto fnd = lookup2.find(existingValue);
            if (fnd != lookup2.end()) {
                names.emplace_back(searchValue);
                auto res = lookup1.emplace(names.back(), fnd->second);
                return res.second;
            }
            return false;
        }